

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O1

void TPZCreateApproximationSpace::CreateInterfaces(TPZCompMesh *cmesh)

{
  TPZCompEl **ppTVar1;
  TPZInterpolationSpace *this;
  long nelem;
  
  if (0 < (cmesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements) {
    nelem = 0;
    do {
      ppTVar1 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(cmesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      if ((*ppTVar1 != (TPZCompEl *)0x0) &&
         (this = (TPZInterpolationSpace *)
                 __dynamic_cast(*ppTVar1,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0),
         this != (TPZInterpolationSpace *)0x0)) {
        TPZInterpolationSpace::CreateInterfaces(this,false);
      }
      nelem = nelem + 1;
    } while (nelem < (cmesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements);
  }
  return;
}

Assistant:

void TPZCreateApproximationSpace::CreateInterfaces(TPZCompMesh &cmesh){
    for(int64_t el = 0; el < cmesh.ElementVec().NElements(); el++)
	{
		TPZCompEl * compEl = cmesh.ElementVec()[el];
		if(!compEl) continue;
        
        TPZInterpolationSpace * interpEl = dynamic_cast<TPZInterpolationSpace *>(compEl);
        if(!interpEl) continue;
        interpEl->CreateInterfaces();
    }
    
}